

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_triplet_to_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (triplet<unsigned_char> *source,size_t pixel_stride_in,uchar *destination,
               size_t pixel_stride,transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  triplet<unsigned_char> tVar1;
  size_t sVar2;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *paVar3;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  paVar3 = &source->field_2;
  for (sVar2 = 0; pixel_stride_in != sVar2; sVar2 = sVar2 + 1) {
    tVar1 = transform_hp2<unsigned_char>::operator()
                      (transform,(((triplet<unsigned_char> *)(paVar3 + -2))->field_0).v1 & mask,
                       ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(paVar3 + -1))->v2 &
                       mask,paVar3->v3 & mask);
    ((anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 *)(destination + sVar2))->v1 =
         (uchar)tVar1.field_0;
    ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(destination + sVar2 + pixel_stride))->
    v2 = (uchar)tVar1.field_1;
    ((anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *)
    (destination + sVar2 + pixel_stride * 2))->v3 = (uchar)tVar1.field_2;
    paVar3 = paVar3 + 3;
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}